

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_add_remove_checked_64(void **param_1)

{
  uint32_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  long lVar4;
  Roaring64Map roaring;
  Roaring64Map local_68;
  
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lVar4 = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar1 = *(uint32_t *)((long)&DAT_00136290 + lVar4);
    bVar3 = ::roaring::Roaring64Map::addChecked(&local_68,uVar1);
    _assert_true((ulong)bVar3,"roaring.addChecked(values32[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2c8);
    bVar3 = ::roaring::Roaring64Map::addChecked(&local_68,uVar1);
    _assert_true((ulong)!bVar3,"roaring.addChecked(values32[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2c9);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x10);
  lVar4 = 0;
  do {
    uVar1 = *(uint32_t *)((long)&DAT_00136290 + lVar4);
    bVar3 = ::roaring::Roaring64Map::removeChecked(&local_68,uVar1);
    _assert_true((ulong)bVar3,"roaring.removeChecked(values32[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2cc);
    bVar3 = ::roaring::Roaring64Map::removeChecked(&local_68,uVar1);
    _assert_true((ulong)!bVar3,"roaring.removeChecked(values32[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2cd);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x10);
  lVar4 = 0;
  do {
    uVar2 = *(uint64_t *)((long)&DAT_00137bb0 + lVar4);
    bVar3 = ::roaring::Roaring64Map::addChecked(&local_68,uVar2);
    _assert_true((ulong)bVar3,"roaring.addChecked(values64[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2d3);
    bVar3 = ::roaring::Roaring64Map::addChecked(&local_68,uVar2);
    _assert_true((ulong)!bVar3,"roaring.addChecked(values64[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2d4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  lVar4 = 0;
  do {
    uVar2 = *(uint64_t *)((long)&DAT_00137bb0 + lVar4);
    bVar3 = ::roaring::Roaring64Map::removeChecked(&local_68,uVar2);
    _assert_true((ulong)bVar3,"roaring.removeChecked(values64[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2d7);
    bVar3 = ::roaring::Roaring64Map::removeChecked(&local_68,uVar2);
    _assert_true((ulong)!bVar3,"roaring.removeChecked(values64[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2d8);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  bVar3 = ::roaring::Roaring64Map::isEmpty(&local_68);
  _assert_true((ulong)bVar3,"roaring.isEmpty()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x2da);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }